

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator::GenerateSerializationCode
          (RepeatedImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldOptions *this_00;
  Printer *printer_local;
  RepeatedImmutableEnumFieldLiteGenerator *this_local;
  
  this_00 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(this_00);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "if (get$capitalized_name$List().size() > 0) {\n  output.writeUInt32NoTag($tag$);\n  output.writeUInt32NoTag($name$MemoizedSerializedSize);\n}\nfor (int i = 0; i < $name$_.size(); i++) {\n  output.writeEnumNoTag($name$_.getInt(i));\n}\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "for (int i = 0; i < $name$_.size(); i++) {\n  output.writeEnum($number$, $name$_.getInt(i));\n}\n"
                      );
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldLiteGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "if (get$capitalized_name$List().size() > 0) {\n"
      "  output.writeUInt32NoTag($tag$);\n"
      "  output.writeUInt32NoTag($name$MemoizedSerializedSize);\n"
      "}\n"
      "for (int i = 0; i < $name$_.size(); i++) {\n"
      "  output.writeEnumNoTag($name$_.getInt(i));\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "for (int i = 0; i < $name$_.size(); i++) {\n"
      "  output.writeEnum($number$, $name$_.getInt(i));\n"
      "}\n");
  }
}